

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

xcb_input_feedback_state_iterator_t
xcb_input_get_feedback_control_feedbacks_iterator(xcb_input_get_feedback_control_reply_t *R)

{
  xcb_input_feedback_state_iterator_t xVar1;
  
  xVar1._8_8_ = (ulong)R->num_feedbacks | 0x2000000000;
  xVar1.data = (xcb_input_feedback_state_t *)(R + 1);
  return xVar1;
}

Assistant:

xcb_input_feedback_state_iterator_t
xcb_input_get_feedback_control_feedbacks_iterator (const xcb_input_get_feedback_control_reply_t *R)
{
    xcb_input_feedback_state_iterator_t i;
    i.data = (xcb_input_feedback_state_t *) (R + 1);
    i.rem = R->num_feedbacks;
    i.index = (char *) i.data - (char *) R;
    return i;
}